

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

bool __thiscall
irr::gui::CGUITabControl::needScrollControl
          (CGUITabControl *this,s32 startIndex,bool withScrollControl,s32 *pos_rightmost)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  pointer ppIVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  
  bVar8 = false;
  if (startIndex < 1) {
    startIndex = 0;
  }
  plVar3 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if (plVar3 != (long *)0x0) {
    bVar8 = false;
    plVar3 = (long *)(**(code **)(*plVar3 + 0x30))(plVar3,0);
    if ((plVar3 != (long *)0x0) &&
       ((this->Tabs).m_data.
        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->Tabs).m_data.
        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      if (withScrollControl) {
        iVar10 = (this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X + -2;
      }
      else {
        iVar10 = *(int *)&this->field_0x48;
      }
      iVar7 = *(int *)&this->field_0x40 + 2;
      ppIVar4 = (this->Tabs).m_data.
                super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar6 = (int)((ulong)((long)(this->Tabs).m_data.
                                  super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3);
      bVar8 = startIndex < iVar6;
      if (startIndex < iVar6) {
        uVar9 = (ulong)(uint)startIndex;
        do {
          if (ppIVar4[uVar9] != (IGUITab *)0x0) {
            uVar5 = (**(code **)(*(long *)&(ppIVar4[uVar9]->super_IGUIElement).super_IEventReceiver
                                + 0xa8))();
            iVar2 = (**(code **)(*plVar3 + 8))(plVar3,uVar5);
            iVar2 = iVar2 + this->TabExtraWidth;
            iVar6 = this->TabMaxWidth;
            iVar1 = iVar6;
            if (iVar2 < iVar6) {
              iVar1 = iVar2;
            }
            if (iVar6 < 1) {
              iVar1 = iVar2;
            }
            iVar7 = iVar7 + iVar1;
          }
          if (iVar10 < iVar7) break;
          uVar9 = uVar9 + 1;
          ppIVar4 = (this->Tabs).m_data.
                    super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          iVar6 = (int)((ulong)((long)(this->Tabs).m_data.
                                      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >>
                       3);
          bVar8 = (int)uVar9 < iVar6;
        } while ((int)uVar9 < iVar6);
      }
      if ((pos_rightmost != (s32 *)0x0) && (!bVar8)) {
        *pos_rightmost = iVar7;
        bVar8 = false;
      }
    }
  }
  return bVar8;
}

Assistant:

bool CGUITabControl::needScrollControl(s32 startIndex, bool withScrollControl, s32 *pos_rightmost)
{
	if (startIndex < 0)
		startIndex = 0;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return false;

	IGUIFont *font = skin->getFont();

	if (Tabs.empty())
		return false;

	if (!font)
		return false;

	s32 pos = AbsoluteRect.UpperLeftCorner.X + 2;
	const s32 pos_right = withScrollControl ? UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 : AbsoluteRect.LowerRightCorner.X;

	for (s32 i = startIndex; i < (s32)Tabs.size(); ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i]) {
			text = Tabs[i]->getText();

			// get text length
			s32 len = calcTabWidth(font, text); // always without withScrollControl here or len would be shortened
			pos += len;
		}

		if (pos > pos_right)
			return true;
	}

	if (pos_rightmost)
		*pos_rightmost = pos;
	return false;
}